

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-test.c++
# Opt level: O2

Own<kj::Directory> __thiscall kj::anon_unknown_0::TempDir::get(TempDir *this)

{
  int osErrorNumber;
  Directory *extraout_RDX;
  undefined8 *in_RSI;
  char *__file;
  Own<kj::Directory> OVar1;
  Fault f;
  AutoCloseFd local_30;
  Fault local_28;
  
  do {
    __file = "";
    if (in_RSI[1] != 0) {
      __file = (char *)*in_RSI;
    }
    local_30.fd = open(__file,0);
    if (-1 < local_30.fd) goto LAB_00258cdb;
    osErrorNumber = _::Debug::getOsErrorNumber(false);
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    _::Debug::Fault::Fault
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0xe3,osErrorNumber,"fd = open(filename.cStr(), O_RDONLY)","");
    _::Debug::Fault::fatal(&local_28);
  }
LAB_00258cdb:
  UnwindDetector::UnwindDetector(&local_30.unwindDetector);
  newDiskDirectory((kj *)this,&local_30);
  AutoCloseFd::~AutoCloseFd(&local_30);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<Directory> get() {
    int fd;
    KJ_SYSCALL(fd = open(filename.cStr(), O_RDONLY));
    return newDiskDirectory(AutoCloseFd(fd));
  }